

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

bool __thiscall ON_Matrix::IsRowOrthoganal(ON_Matrix *this)

{
  bool bVar1;
  double **ppdVar2;
  bool local_42;
  bool rc;
  double **this_m;
  int local_30;
  int j;
  int i1;
  int i0;
  double d;
  double d1;
  double d0;
  ON_Matrix *this_local;
  
  ppdVar2 = ThisM(this);
  local_42 = false;
  if (this->m_row_count <= this->m_col_count) {
    local_42 = 0 < this->m_row_count;
  }
  j = 0;
  while( true ) {
    bVar1 = false;
    if (j < this->m_row_count) {
      bVar1 = local_42;
    }
    local_30 = j;
    if (!bVar1) break;
    while( true ) {
      local_30 = local_30 + 1;
      bVar1 = false;
      if (local_30 < this->m_row_count) {
        bVar1 = local_42;
      }
      if (bVar1 == false) break;
      _i1 = 0.0;
      d = 0.0;
      d1 = 0.0;
      for (this_m._4_4_ = 0; this_m._4_4_ < this->m_col_count; this_m._4_4_ = this_m._4_4_ + 1) {
        d1 = ABS(ppdVar2[j][this_m._4_4_]) + d1;
        d = ABS(ppdVar2[j][this_m._4_4_]) + d;
        _i1 = ppdVar2[j][this_m._4_4_] * ppdVar2[local_30][this_m._4_4_] + _i1;
      }
      if (((d1 <= 2.220446049250313e-16) || (d <= 2.220446049250313e-16)) ||
         (d1 * d * 1.490116119385e-08 <= ABS(_i1))) {
        local_42 = false;
      }
    }
    j = j + 1;
  }
  return local_42;
}

Assistant:

bool ON_Matrix::IsRowOrthoganal() const
{
  double d0, d1, d;
  int i0, i1, j;
  double const*const* this_m = ThisM();
  bool rc = ( m_row_count <= m_col_count && m_row_count > 0 );
  for ( i0 = 0; i0 < m_row_count && rc; i0++ ) for ( i1 = i0+1; i1 < m_row_count && rc; i1++ ) {
    d0 = d1 = d = 0.0;
    for ( j = 0; j < m_col_count; j++ ) {
      d0 += fabs(this_m[i0][j]);
      d1 += fabs(this_m[i0][j]);
      d  += this_m[i0][j]*this_m[i1][j];
    }
    if ( d0 <=  ON_EPSILON || d1 <=  ON_EPSILON || fabs(d) >= d0*d1* ON_SQRT_EPSILON )
      rc = false;
  }
  return rc;
}